

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2frames.cpp
# Opt level: O3

void __thiscall Http2::FrameWriter::FrameWriter(FrameWriter *this)

{
  value_type_conflict3 *__val;
  pointer puVar1;
  
  (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = (pointer)operator_new(9);
  (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = puVar1;
  (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar1 + 9;
  *puVar1 = '\0';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\0';
  puVar1[5] = '\0';
  puVar1[6] = '\0';
  puVar1[7] = '\0';
  puVar1[8] = '\0';
  (this->frame).buffer.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = puVar1 + 9;
  return;
}

Assistant:

FrameWriter::FrameWriter()
{
}